

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compute_sync_words.cc
# Opt level: O1

int main(int argc,char **argv)

{
  void *pvVar1;
  size_t sVar2;
  size_t sVar3;
  runtime_error *prVar4;
  uint i_2;
  char *__format;
  int *in_R9;
  int b;
  uint i;
  long lVar5;
  bool bVar6;
  array<unsigned_char,_4UL> syncWord;
  array<unsigned_char,_4UL> nrzmSyncWord;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  Viterbi v;
  array<unsigned_char,_4UL> local_b0;
  _Type local_ac;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_90;
  string local_78;
  char local_54 [4];
  Viterbi local_50;
  
  decoder::Viterbi::Viterbi(&local_50);
  local_b0._M_elems[0] = '\x1a';
  local_b0._M_elems[1] = 0xcf;
  local_b0._M_elems[2] = 0xfc;
  local_b0._M_elems[3] = '\x1d';
  sVar2 = correct_convolutional_sse_encode_len(local_50.v_,4);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_90,sVar2,(allocator_type *)&local_78);
  sVar3 = correct_convolutional_sse_encode
                    (local_50.v_,local_b0._M_elems,4,
                     local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start);
  if (sVar3 != sVar2) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x31;
    util::str<char[33],char[107],char[2],int>
              (&local_78,(util *)"Assertion `rv == len` failed at ",
               (char (*) [33])
               "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/src/decoder/compute_sync_words.cc"
               ,(char (*) [107])":",(char (*) [2])&local_a8,in_R9);
    std::runtime_error::runtime_error(prVar4,(string *)&local_78);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  printf("LRIT:   phase 0: 0x");
  lVar5 = 0;
  do {
    printf("%02x",(ulong)local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start[lVar5]);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 8);
  putchar(10);
  printf("LRIT: phase 180: 0x");
  lVar5 = 0;
  do {
    printf("%02x",(ulong)(local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar5] ^ 0xff));
    lVar5 = lVar5 + 1;
  } while (lVar5 != 8);
  putchar(10);
  b = 0;
  do {
    local_ac = (_Type)nrzmEncode(local_b0,b);
    sVar2 = correct_convolutional_sse_encode_len(local_50.v_,4);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_a8,sVar2,(allocator_type *)&local_78);
    sVar3 = correct_convolutional_sse_encode
                      (local_50.v_,local_ac,4,
                       (uint8_t *)
                       CONCAT44(local_a8.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start._4_4_,
                                local_a8.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start._0_4_));
    if (sVar3 != sVar2) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_54[0] = 'I';
      local_54[1] = '\0';
      local_54[2] = '\0';
      local_54[3] = '\0';
      util::str<char[33],char[107],char[2],int>
                (&local_78,(util *)"Assertion `rv == len` failed at ",
                 (char (*) [33])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/src/decoder/compute_sync_words.cc"
                 ,(char (*) [107])":",(char (*) [2])local_54,in_R9);
      std::runtime_error::runtime_error(prVar4,(string *)&local_78);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    __format = "HRIT: phase 180: 0x";
    if (b == 0) {
      __format = "HRIT:   phase 0: 0x";
    }
    printf(__format);
    lVar5 = 0;
    do {
      printf("%02x",(ulong)*(byte *)(CONCAT44(local_a8.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                              local_a8.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                    lVar5));
      lVar5 = lVar5 + 1;
    } while (lVar5 != 8);
    putchar(10);
    pvVar1 = (void *)CONCAT44(local_a8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start._4_4_,
                              local_a8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start._0_4_);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,(long)local_a8.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar1
                     );
    }
    bVar6 = b == 0;
    b = b + 1;
  } while (bVar6);
  if (local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uint8_t *)0x0) {
    operator_delete(local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  decoder::Viterbi::~Viterbi(&local_50);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  decoder::Viterbi v;

  // Use array of bytes instead of fundamental type so we
  // don't need to worry about host byte order.
  std::array<uint8_t, 4> syncWord;
  syncWord[0] = 0x1A;
  syncWord[1] = 0xCF;
  syncWord[2] = 0xFC;
  syncWord[3] = 0x1D;

  // LRIT uses NRZ-L "coding" (which is really no coding at all).
  // To get the encoded sync word we can directly Viterbi encode it.
  // Then we can invert it to get its dual to deal with phase
  // ambiguity.
  auto len = v.encodeLength(syncWord.size());
  std::vector<uint8_t> buf(len);
  auto rv = v.encode(syncWord.data(), syncWord.size(), buf.data());
  ASSERT(rv == len);

  // 0 degree phase shift
  printf("LRIT:   phase 0: 0x");
  for (unsigned i = 0; i < 8; i++) {
    printf("%02x", (uint8_t) buf[i]);
  }
  printf("\n");

  // 180 degree phase shift
  printf("LRIT: phase 180: 0x");
  for (unsigned i = 0; i < 8; i++) {
    printf("%02x", (uint8_t) ~buf[i]);
  }
  printf("\n");

  // HRIT uses NRZ-M coding. In this scheme, a 0 means no bit change,
  // and a 1 means a bit change. We have to get an encoded sync word
  // for 2 different initial states to deal with phase ambiguity.
  for (unsigned i = 0; i < 2; i++) {
    auto nrzmSyncWord = nrzmEncode(syncWord, i);
    auto len = v.encodeLength(nrzmSyncWord.size());
    std::vector<uint8_t> buf(len);
    auto rv = v.encode(nrzmSyncWord.data(), nrzmSyncWord.size(), buf.data());
    ASSERT(rv == len);

    if (i == 0) {
      // 0 degree phase shift
      printf("HRIT:   phase 0: 0x");
    } else {
      // 180 degree phase shift
      printf("HRIT: phase 180: 0x");
    }
    for (unsigned i = 0; i < 8; i++) {
      printf("%02x", (uint8_t) buf[i]);
    }
    printf("\n");
  }
}